

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yarn3s.hpp
# Opt level: O1

basic_istream<wchar_t,_std::char_traits<wchar_t>_> *
trng::operator>>(basic_istream<wchar_t,_std::char_traits<wchar_t>_> *in,yarn3s *R)

{
  basic_istream<wchar_t,_std::char_traits<wchar_t>_> *pbVar1;
  parameter_type P_new;
  status_type S_new;
  delim_c local_58;
  delim_c local_57;
  delim_c local_56;
  delim_c local_55;
  undefined4 local_54;
  delim_str local_50;
  mrg_parameter<int,_3,_trng::yarn3s> local_48;
  mrg_status<int,_3,_trng::yarn3s> local_3c;
  
  local_48.a[2] = 0;
  local_48.a[0] = 0;
  local_48.a[1] = 0;
  local_3c.r[0] = 0;
  local_3c.r[1] = 1;
  local_3c.r[2] = 1;
  local_54 = *(undefined4 *)(in + *(long *)(*(long *)in + -0x18) + 0x18);
  *(undefined4 *)(in + *(long *)(*(long *)in + -0x18) + 0x18) = 0x26;
  utility::operator>>(in,(ignore_spaces_cl *)&local_50);
  local_55.c = '[';
  pbVar1 = utility::operator>>(in,&local_55);
  local_50.str = yarn3s::name();
  pbVar1 = utility::operator>>(pbVar1,&local_50);
  local_56.c = ' ';
  pbVar1 = utility::operator>>(pbVar1,&local_56);
  pbVar1 = operator>>(pbVar1,&local_48);
  local_57.c = ' ';
  pbVar1 = utility::operator>>(pbVar1,&local_57);
  pbVar1 = operator>>(pbVar1,&local_3c);
  local_58.c = ']';
  utility::operator>>(pbVar1,&local_58);
  if (((byte)in[*(long *)(*(long *)in + -0x18) + 0x20] & 5) == 0) {
    (R->P).a[2] = local_48.a[2];
    *(undefined8 *)(R->P).a = local_48.a._0_8_;
    *(ulong *)(R->S).r = CONCAT44(local_3c.r[1],local_3c.r[0]);
    (R->S).r[2] = local_3c.r[2];
  }
  *(undefined4 *)(in + *(long *)(*(long *)in + -0x18) + 0x18) = local_54;
  return in;
}

Assistant:

std::basic_istream<char_t, traits_t> &operator>>(
        std::basic_istream<char_t, traits_t> &in, yarn3s &R) {
      yarn3s::parameter_type P_new;
      yarn3s::status_type S_new;
      std::ios_base::fmtflags flags(in.flags());
      in.flags(std::ios_base::dec | std::ios_base::fixed | std::ios_base::left);
      in >> utility::ignore_spaces();
      in >> utility::delim('[') >> utility::delim(yarn3s::name()) >> utility::delim(' ') >>
          P_new >> utility::delim(' ') >> S_new >> utility::delim(']');
      if (in) {
        R.P = P_new;
        R.S = S_new;
      }
      in.flags(flags);
      return in;
    }